

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O0

void __thiscall
NewEdgeCalculator::iterateRemainingCovAp2
          (NewEdgeCalculator *this,AlignmentRecord *ap2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          bool pe1,AlignmentRecord *ap1,int *tc,double *prob0,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          bool pe2,uint *pos2)

{
  uint uVar1;
  NewEdgeCalculator *this_00;
  NewEdgeCalculator *pNVar2;
  const_reference pvVar3;
  byte in_CL;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *in_RDX;
  AlignmentRecord *in_RSI;
  AlignmentRecord *in_R8;
  int *in_R9;
  byte in_stack_00000018;
  uint *in_stack_00000020;
  value_type *v2;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  
  do {
    while( true ) {
      this_00 = (NewEdgeCalculator *)(ulong)*in_stack_00000020;
      pNVar2 = (NewEdgeCalculator *)
               std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
               size(in_RDX);
      if (pNVar2 <= this_00) {
        return;
      }
      pvVar3 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
               operator[](in_RDX,(ulong)*in_stack_00000020);
      if (((in_CL & 1) != 0) && ((in_stack_00000018 & 1) != 0)) break;
      in_stack_ffffffffffffffa4 = pvVar3->read;
      pvVar3 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
               back((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *
                    )CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (in_stack_ffffffffffffffa4 != pvVar3->read) {
        return;
      }
      calculateProb0(this_00,(mapValue *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      *in_stack_00000020 = *in_stack_00000020 + 1;
      *in_R9 = *in_R9 + 1;
    }
    in_stack_ffffffffffffffac = AlignmentRecord::getStart2(in_RSI);
    uVar1 = AlignmentRecord::getEnd2(in_R8);
    if (uVar1 < in_stack_ffffffffffffffac) {
      in_stack_ffffffffffffffa8 = pvVar3->ref;
      uVar1 = AlignmentRecord::getStart2(in_RSI);
      if (uVar1 <= in_stack_ffffffffffffffa8) {
        return;
      }
    }
    calculateProb0(this_00,(mapValue *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                   ,(double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    *in_stack_00000020 = *in_stack_00000020 + 1;
    *in_R9 = *in_R9 + 1;
  } while( true );
}

Assistant:

void NewEdgeCalculator::iterateRemainingCovAp2(const AlignmentRecord& ap2, const std::vector<AlignmentRecord::mapValue>& cov_ap2, bool pe1, const AlignmentRecord& ap1, int& tc, double& prob0, const std::vector<AlignmentRecord::mapValue>& cov_ap1, bool pe2, unsigned int& pos2) const
{
    while(pos2 < cov_ap2.size()){
        auto& v2 = cov_ap2[pos2];
        if(pe1 && pe2){
            if(ap2.getStart2() > ap1.getEnd2() && v2.ref >= ap2.getStart2()) break;
            else {
                calculateProb0(v2,prob0);
                pos2++;
                tc++;
            }
        }
       else if (v2.read == cov_ap1.back().read){
            calculateProb0(v2,prob0);
            pos2++;
            tc++;
        } else break;
    }
}